

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O3

void __thiscall CPU::ASL_ZP(CPU *this)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  
  this->cycles = 5;
  uVar2 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)this->pc);
  this->pc = this->pc + 1;
  this->cycles = this->cycles - 2;
  iVar3 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)(uVar2 & 0xff));
  this->cycles = this->cycles - 1;
  bVar1 = (byte)iVar3 * '\x02';
  (this->field_6).ps =
       bVar1 & 0x80 | (bVar1 == 0) * '\x02' | (this->field_6).ps & 0x7c | (byte)iVar3 >> 7;
  (*this->memory->_vptr_MemoryBus[3])(this->memory,(ulong)(uVar2 & 0xff),(ulong)bVar1);
  this->cycles = this->cycles - 1;
  return;
}

Assistant:

void CPU::ASL_ZP()
{
    cycles = 5;
    uint8_t addr = GetByte();
    uint8_t data = ReadByte(addr);
    C = (data & 0b10000000) > 0;
    data <<= 1;
    cycles--;
    Z = (data == 0);
    N = (data & 0b10000000) > 0;
    WriteByte(addr, data);
}